

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::overlapMerge
          (AlignmentRecord *this,string *algn,string *ref,AlignmentRecord *ar,string *dna,
          string *qualities,string *nucigar,int *c_pos1,int *c_pos2,int *q_pos1,int *q_pos2,
          int *ref_pos,int *ref_rel_pos,int i,int j)

{
  byte bVar1;
  byte bVar2;
  int *piVar3;
  vector<char,_std::allocator<char>_> *pvVar4;
  ShortDnaSequence *this_00;
  char cVar5;
  ShortDnaSequence *this_01;
  bool bVar6;
  bool bVar7;
  char local_a2;
  char local_a1;
  string *local_a0;
  char local_91;
  string *local_90;
  string *local_88;
  string *local_80;
  ulong local_78;
  string r;
  allocator local_50 [32];
  
  local_90 = algn;
  local_80 = dna;
  std::__cxx11::string::string((string *)&r,"",local_50);
  local_a0 = ref;
  local_88 = qualities;
  if (i == 1) {
    bVar1 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[*c_pos1];
    std::__cxx11::string::string((string *)local_50,(string *)&this->reference_seq1);
    this_00 = &this->sequence1;
  }
  else {
    bVar1 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[*c_pos1];
    std::__cxx11::string::string((string *)local_50,(string *)&this->reference_seq2);
    this_00 = &this->sequence2;
  }
  std::__cxx11::string::operator=((string *)&r,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  pvVar4 = &ar->cigar2_unrolled;
  if (j == 1) {
    pvVar4 = &ar->cigar1_unrolled;
  }
  this_01 = &ar->sequence1;
  if (j != 1) {
    this_01 = &ar->sequence2;
  }
  bVar2 = (pvVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start[*c_pos2];
  cVar5 = (char)nucigar;
  if ((bVar1 == 0x4d) && (bVar2 == 0x4d)) {
LAB_0018eabf:
    local_50[0] = (allocator)ShortDnaSequence::operator[](this_00,(long)*q_pos1);
    local_a1 = ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
    local_a2 = ShortDnaSequence::operator[](this_01,(long)*q_pos2);
    local_91 = ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
    computeEntry((char *)local_50,&local_a1,&local_a2,&local_91);
    std::__cxx11::string::push_back((char)local_80);
    std::__cxx11::string::push_back((char)local_90);
    std::__cxx11::string::push_back((char)local_88);
    std::__cxx11::string::push_back(cVar5);
    if (bVar1 == 0x49) {
      std::__cxx11::string::push_back((char)local_a0);
    }
    else {
      std::__cxx11::string::at((ulong)&r);
      std::__cxx11::string::push_back((char)local_a0);
LAB_0018ec58:
      *ref_rel_pos = *ref_rel_pos + 1;
      *ref_pos = *ref_pos + 1;
    }
    *q_pos1 = *q_pos1 + 1;
    *q_pos2 = *q_pos2 + 1;
    *c_pos1 = *c_pos1 + 1;
    goto LAB_0018ec82;
  }
  if ((bVar1 == 0x53) && (bVar2 == 0x53)) goto LAB_0018ec58;
  if ((bVar1 == 0x49) && (bVar2 == 0x49)) goto LAB_0018eabf;
  if ((bVar1 == 0x44) && (bVar2 == 0x44)) {
LAB_0018ebac:
    *c_pos1 = *c_pos1 + 1;
    *c_pos2 = *c_pos2 + 1;
    std::__cxx11::string::at((ulong)&r);
    std::__cxx11::string::push_back((char)local_a0);
    *ref_rel_pos = *ref_rel_pos + 1;
    *ref_pos = *ref_pos + 1;
    if ((bVar1 == 0x44) || (bVar2 == 0x44)) {
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::string::push_back((char)local_90);
    }
    c_pos2 = q_pos1;
    piVar3 = q_pos2;
    if (bVar1 != 0x53) {
joined_r0x0018efa4:
      c_pos2 = piVar3;
      if (bVar2 != 0x53) goto LAB_0018ec85;
    }
  }
  else {
    local_78 = (ulong)bVar2;
    bVar6 = bVar1 == 0x44;
    bVar7 = bVar1 == 0x48;
    if (((bVar7 || bVar6) && bVar2 == 0x48) ||
       (((bVar7 && bVar2 == 0x44 || (bVar6 && bVar2 == 0x53)) || (bVar1 == 0x53 && bVar2 == 0x44))))
    goto LAB_0018ebac;
    if (((bVar1 != 0x4d) || (0xf < bVar2 - 0x44)) || ((0x8011U >> (bVar2 - 0x44 & 0x1f) & 1) == 0))
    {
      if ((((!bVar7 && !bVar6) && bVar1 != 0x53 || bVar2 != 0x4d) &&
          (bVar1 != 0x53 || bVar2 != 0x48)) && (bVar2 != 0x53 || bVar1 != 0x48)) {
        if ((bVar1 != 0x49) && (bVar2 != 0x49)) goto LAB_0018ec85;
        if (bVar1 == 0x49) {
          std::__cxx11::string::push_back(cVar5);
          ShortDnaSequence::operator[](this_00,(long)*q_pos1);
          std::__cxx11::string::push_back((char)local_80);
          ShortDnaSequence::operator[](this_00,(long)*q_pos1);
          std::__cxx11::string::push_back((char)local_90);
          ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
          std::__cxx11::string::push_back((char)local_88);
          std::__cxx11::string::push_back((char)local_a0);
          *c_pos1 = *c_pos1 + 1;
          c_pos2 = q_pos1;
        }
        else {
          std::__cxx11::string::push_back(cVar5);
          ShortDnaSequence::operator[](this_01,(long)*q_pos2);
          std::__cxx11::string::push_back((char)local_80);
          ShortDnaSequence::operator[](this_01,(long)*q_pos2);
          std::__cxx11::string::push_back((char)local_90);
          ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
          std::__cxx11::string::push_back((char)local_88);
          std::__cxx11::string::push_back((char)local_a0);
          *c_pos2 = *c_pos2 + 1;
          c_pos2 = q_pos2;
        }
        goto LAB_0018ec82;
      }
      if (bVar1 == 0x4d) goto LAB_0018ee1d;
      if (bVar2 != 0x4d) {
        *ref_rel_pos = *ref_rel_pos + 1;
        *ref_pos = *ref_pos + 1;
        *c_pos1 = *c_pos1 + 1;
        *c_pos2 = *c_pos2 + 1;
        c_pos2 = q_pos2;
        if (bVar1 == 0x53) {
          c_pos2 = q_pos1;
        }
        goto LAB_0018ec82;
      }
      std::__cxx11::string::push_back(cVar5);
      ShortDnaSequence::operator[](this_01,(long)*q_pos2);
      std::__cxx11::string::push_back((char)local_80);
      ShortDnaSequence::operator[](this_01,(long)*q_pos2);
      std::__cxx11::string::push_back((char)local_90);
      ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
      std::__cxx11::string::push_back((char)local_88);
      std::__cxx11::string::at((ulong)&r);
      std::__cxx11::string::push_back((char)local_a0);
      *ref_rel_pos = *ref_rel_pos + 1;
      *ref_pos = *ref_pos + 1;
      *c_pos1 = *c_pos1 + 1;
      *c_pos2 = *c_pos2 + 1;
      *q_pos2 = *q_pos2 + 1;
      piVar3 = q_pos1;
      bVar2 = bVar1;
      goto joined_r0x0018efa4;
    }
LAB_0018ee1d:
    std::__cxx11::string::push_back(cVar5);
    ShortDnaSequence::operator[](this_00,(long)*q_pos1);
    std::__cxx11::string::push_back((char)local_80);
    ShortDnaSequence::operator[](this_00,(long)*q_pos1);
    std::__cxx11::string::push_back((char)local_90);
    ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
    std::__cxx11::string::push_back((char)local_88);
    std::__cxx11::string::at((ulong)&r);
    std::__cxx11::string::push_back((char)local_a0);
    *ref_rel_pos = *ref_rel_pos + 1;
    *ref_pos = *ref_pos + 1;
    *c_pos1 = *c_pos1 + 1;
    *c_pos2 = *c_pos2 + 1;
    *q_pos1 = *q_pos1 + 1;
    c_pos2 = q_pos2;
    if ((int)local_78 != 0x53) goto LAB_0018ec85;
  }
LAB_0018ec82:
  *c_pos2 = *c_pos2 + 1;
LAB_0018ec85:
  std::__cxx11::string::~string((string *)&r);
  return;
}

Assistant:

void AlignmentRecord::overlapMerge(std::string& algn,std::string& ref,const AlignmentRecord& ar, std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos1, int& c_pos2, int& q_pos1, int& q_pos2, int& ref_pos, int& ref_rel_pos, int i, int j) const{
    char c1, c2;
    const ShortDnaSequence* s1,* s2 = 0;
    std::string r = "";
    if (i == 1){
        c1 = this->cigar1_unrolled[c_pos1];
        s1 = &this->sequence1;
        r = this->getReferenceSeq1();
        if(j == 1){
            c2 = ar.getCigar1Unrolled()[c_pos2];
            s2 = &ar.getSequence1();
        } else {
            c2 = ar.getCigar2Unrolled()[c_pos2];
            s2 = &ar.getSequence2();
        }
    } else {
        c1 = this->cigar2_unrolled[c_pos1];

        s1 = &this->sequence2;
        r = this->getReferenceSeq2();
        if(j == 1){
            c2 = ar.getCigar1Unrolled()[c_pos2];
            s2 = &ar.getSequence1();
        } else {
            c2 = ar.getCigar2Unrolled()[c_pos2];
            s2 = &ar.getSequence2();
        }
    }
    if((c1 == 'M' && c2 == 'M') || (c1 == 'S' && c2 == 'S') || (c1 == 'I' && c2 == 'I')){

        if (c1 != 'S'){
            std::pair<char,char> resPair = computeEntry((*s1)[q_pos1],s1->qualityChar(q_pos1),(*s2)[q_pos2],s2->qualityChar(q_pos2));
            dna += resPair.first;
            algn += resPair.first;
            qualities += resPair.second;
            nucigar += c1;
            if(c1=='I'){
                ref+= 'I';
            }else{
                ref+= r.at(ref_rel_pos);
            }
        }
        if (c1 != 'I'){
            ref_rel_pos++;
            ref_pos++;
        }
        q_pos1++;
        q_pos2++;
        c_pos1++;
        c_pos2++;
    } else if ((c1 == 'D' && c2 == 'D') || (c1 == 'H' && c2 == 'H') || (c1 == 'D' && c2 == 'H') || (c1 == 'H' && c2 == 'D') || (c1 == 'D' && c2 == 'S') || (c1 == 'S' && c2 == 'D')){

        c_pos1++;
        c_pos2++;
        ref+= r.at(ref_rel_pos);
        ref_rel_pos++;
        ref_pos++;
        if (c1 == 'D' || c2 == 'D'){
            nucigar += 'D';
            algn +='D';
        }
        if (c1 == 'S'){
            q_pos1++;
        } else if(c2 == 'S'){
            q_pos2++;
        }
    } else if ((c1 == 'M' && (c2 == 'D' || c2 == 'H' || c2 == 'S')) || ((c1 == 'D' || c1 == 'H' || c1 == 'S') && c2 == 'M') || (c1 == 'S' && c2 == 'H') || (c1 == 'H' && c2 == 'S')) {

        if (c1 == 'M'){
            nucigar += 'M';
            dna += (*s1)[q_pos1];
            algn+=(*s1)[q_pos1];
            qualities += s1->qualityChar(q_pos1);
            ref+= r.at(ref_rel_pos);
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
            if (c2 == 'S') q_pos2++;
        } else if (c2 == 'M'){
            nucigar += 'M';
            dna +=  (*s2)[q_pos2];
            algn+= (*s2)[q_pos2];
            qualities += s2->qualityChar(q_pos2);
            ref+= r.at(ref_rel_pos);
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
            if (c1 == 'S') q_pos1++;
        } else if (c1 == 'S'){
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
        } else {
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
        }
    } else if (c1 == 'I' || c2 == 'I'){

        if(c1 == 'I'){
            nucigar += 'I';
            dna += (*s1)[q_pos1];
            algn+=(*s1)[q_pos1];
            qualities += s1->qualityChar(q_pos1);
            ref+= 'I';
            c_pos1++;
            q_pos1++;
        } else {
            nucigar += 'I';
            dna +=  (*s2)[q_pos2];
            algn+=(*s2)[q_pos2];
            qualities += s2->qualityChar(q_pos2);
            ref+= 'I';
            c_pos2++;
            q_pos2++;
        }
    } else{
        assert(false);
    }
}